

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_grammar.cpp
# Opt level: O0

CapabilitySet * __thiscall
spvtools::AssemblyGrammar::filterCapsAgainstTargetEnv
          (CapabilitySet *__return_storage_ptr__,AssemblyGrammar *this,Capability *cap_array,
          uint32_t count)

{
  spv_result_t sVar1;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_58;
  spv_operand_desc local_38;
  spv_operand_desc entry;
  uint32_t i;
  uint32_t version;
  Capability *pCStack_20;
  uint32_t count_local;
  Capability *cap_array_local;
  AssemblyGrammar *this_local;
  CapabilitySet *cap_set;
  
  i._3_1_ = 0;
  version = count;
  pCStack_20 = cap_array;
  cap_array_local = &this->target_env_;
  this_local = (AssemblyGrammar *)__return_storage_ptr__;
  EnumSet<spv::Capability>::EnumSet(__return_storage_ptr__);
  entry._4_4_ = spvVersionForTargetEnv(this->target_env_);
  for (entry._0_4_ = 0; (uint)entry < version; entry._0_4_ = (uint)entry + 1) {
    local_38 = (spv_operand_desc)0x0;
    sVar1 = lookupOperand(this,SPV_OPERAND_TYPE_CAPABILITY,pCStack_20[(uint)entry],&local_38);
    if ((sVar1 == SPV_SUCCESS) &&
       ((((local_38->minVersion <= entry._4_4_ && (entry._4_4_ <= local_38->lastVersion)) ||
         (local_38->numExtensions != 0)) || (local_38->numCapabilities != 0)))) {
      EnumSet<spv::Capability>::insert(&local_58,__return_storage_ptr__,pCStack_20 + (uint)entry);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CapabilitySet AssemblyGrammar::filterCapsAgainstTargetEnv(
    const spv::Capability* cap_array, uint32_t count) const {
  CapabilitySet cap_set;
  const auto version = spvVersionForTargetEnv(target_env_);
  for (uint32_t i = 0; i < count; ++i) {
    spv_operand_desc entry = {};
    if (SPV_SUCCESS == lookupOperand(SPV_OPERAND_TYPE_CAPABILITY,
                                     static_cast<uint32_t>(cap_array[i]),
                                     &entry)) {
      // This token is visible in this environment if it's in an appropriate
      // core version, or it is enabled by a capability or an extension.
      if ((version >= entry->minVersion && version <= entry->lastVersion) ||
          entry->numExtensions > 0u || entry->numCapabilities > 0u) {
        cap_set.insert(cap_array[i]);
      }
    }
  }
  return cap_set;
}